

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialog::done(QInputDialog *this,int result)

{
  long lVar1;
  bool bVar2;
  InputMode IVar3;
  int _t1;
  char *pcVar4;
  QObject *pQVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  double _t1_00;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialog::done(&this->super_QDialog,result);
  if (result != 0) {
    IVar3 = inputMode(this);
    if (IVar3 == IntInput) {
      _t1 = intValue(this);
      intValueSelected(this,_t1);
    }
    else if (IVar3 == DoubleInput) {
      _t1_00 = doubleValue(this);
      doubleValueSelected(this,_t1_00);
    }
    else {
      textValue((QString *)&local_40,this);
      textValueSelected(this,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x350));
  if (bVar2) {
    pcVar6 = *(char **)(lVar1 + 0x368);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)&QByteArray::_empty;
    }
    pcVar6 = signalForMember(pcVar6);
    if ((*(long *)(lVar1 + 0x350) == 0) || (*(int *)(*(long *)(lVar1 + 0x350) + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = *(QObject **)(lVar1 + 0x358);
    }
    pcVar4 = *(char **)(lVar1 + 0x368);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QObject::disconnect((QObject *)this,pcVar6,pQVar5,pcVar4);
    QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)(lVar1 + 0x350),(QObject *)0x0);
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialog::done(int result)
{
    Q_D(QInputDialog);
    QDialog::done(result);
    if (result) {
        InputMode mode = inputMode();
        switch (mode) {
        case DoubleInput:
            emit doubleValueSelected(doubleValue());
            break;
        case IntInput:
            emit intValueSelected(intValue());
            break;
        default:
            Q_ASSERT(mode == TextInput);
            emit textValueSelected(textValue());
        }
    }
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, signalForMember(d->memberToDisconnectOnClose),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}